

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

String * __thiscall Path::name(String *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  size_t sVar2;
  char *ch;
  
  bVar1 = String::endsWith(&this->super_String,'/',CaseSensitive);
  if (bVar1) {
    sVar2 = String::lastIndexOf(&this->super_String,'/',
                                (this->super_String).mString._M_string_length - 2,CaseSensitive);
    if (sVar2 == 0xffffffffffffffff) {
      (__return_storage_ptr__->mString)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mString).field_2;
      (__return_storage_ptr__->mString)._M_string_length = 0;
      (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
    }
    else {
      String::mid(__return_storage_ptr__,&this->super_String,sVar2 + 1,
                  ((this->super_String).mString._M_string_length - sVar2) - 2);
    }
  }
  else {
    ch = fileName(this,(size_t *)0x0);
    String::String(__return_storage_ptr__,ch,0xffffffffffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

String Path::name() const
{
    if (endsWith('/')) {
        const size_t secondLastSlash = lastIndexOf('/', size() - 2);
        if (secondLastSlash != String::npos) {
            return mid(secondLastSlash + 1, size() - secondLastSlash - 2);
        }
        return String();
    } else {
        return fileName();
    }
}